

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O0

int ExorLinkCubeIteratorNext(Cube **pGroup)

{
  byte bVar1;
  int iVar2;
  Cube *pCVar3;
  long lVar4;
  int local_20;
  int local_1c;
  int c;
  int i;
  Cube **pGroup_local;
  
  if (fWorking == 0) {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x237,"int ExorLinkCubeIteratorNext(Cube **)");
  }
  if (nVisitedGroups == nGroups) {
    pGroup_local._4_4_ = 0;
  }
  else {
    if (fMinLitGroupsFirst[nDist] == 0) {
      GroupCostBest = -1;
      for (local_1c = 0; local_1c < nGroups; local_1c = local_1c + 1) {
        if (((VisitedGroups & s_BitMasks[local_1c]) == 0) && (GroupCostBest < GroupCosts[local_1c]))
        {
          GroupCostBest = GroupCosts[local_1c];
          GroupCostBestNum = local_1c;
        }
      }
      if (GroupCostBest == -1) {
        __assert_fail("GroupCostBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                      ,0x255,"int ExorLinkCubeIteratorNext(Cube **)");
      }
    }
    else {
      GroupCostBest = 1000000;
      for (local_1c = 0; local_1c < nGroups; local_1c = local_1c + 1) {
        if (((VisitedGroups & s_BitMasks[local_1c]) == 0) && (GroupCosts[local_1c] < GroupCostBest))
        {
          GroupCostBest = GroupCosts[local_1c];
          GroupCostBestNum = local_1c;
        }
      }
      if (GroupCostBest == 1000000) {
        __assert_fail("GroupCostBest != LARGE_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                      ,0x249,"int ExorLinkCubeIteratorNext(Cube **)");
      }
    }
    LastGroup = 0;
    for (local_20 = 0; local_20 < nCubes; local_20 = local_20 + 1) {
      CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][local_20];
      LastGroup = s_BitMasks[CubeNum] | LastGroup;
      if (ELCubes[CubeNum] == (Cube *)0x0) {
        pCVar3 = GetFreeCube();
        ELCubes[CubeNum] = pCVar3;
        for (local_1c = 0; local_1c < g_CoverInfo.nWordsIn; local_1c = local_1c + 1) {
          ELCubes[CubeNum]->pCubeDataIn[local_1c] = DammyBitData[local_1c];
        }
        NewZ = 0;
        if (DiffVars[0] < 0) {
          Value = s_ELCubeRules[nDist][CubeNum][nDiffVarsIn];
          if (Value == 0) {
            for (local_1c = 0; local_1c < g_CoverInfo.nWordsOut; local_1c = local_1c + 1) {
              Temp = pCA->pCubeDataOut[local_1c];
              ELCubes[CubeNum]->pCubeDataOut[local_1c] = Temp;
              NewZ = (uint)BitCount[Temp & 0xffff] + (uint)BitCount[Temp >> 0x10] + NewZ;
            }
          }
          else if (Value == 1) {
            for (local_1c = 0; local_1c < g_CoverInfo.nWordsOut; local_1c = local_1c + 1) {
              Temp = pCB->pCubeDataOut[local_1c];
              ELCubes[CubeNum]->pCubeDataOut[local_1c] = Temp;
              NewZ = (uint)BitCount[Temp & 0xffff] + (uint)BitCount[Temp >> 0x10] + NewZ;
            }
          }
          else if (Value == 2) {
            for (local_1c = 0; local_1c < g_CoverInfo.nWordsOut; local_1c = local_1c + 1) {
              Temp = pCA->pCubeDataOut[local_1c] ^ pCB->pCubeDataOut[local_1c];
              ELCubes[CubeNum]->pCubeDataOut[local_1c] = Temp;
              NewZ = (uint)BitCount[Temp & 0xffff] + (uint)BitCount[Temp >> 0x10] + NewZ;
            }
          }
        }
        else {
          for (local_1c = 0; local_1c < g_CoverInfo.nWordsOut; local_1c = local_1c + 1) {
            ELCubes[CubeNum]->pCubeDataOut[local_1c] = pCA->pCubeDataOut[local_1c];
          }
          NewZ = (int)pCA->z;
        }
        for (local_1c = 0; local_1c < nDiffVarsIn; local_1c = local_1c + 1) {
          Value = DiffVarValues[local_1c][s_ELCubeRules[nDist][CubeNum][local_1c]];
          ELCubes[CubeNum]->pCubeDataIn[DiffVarWords[local_1c]] =
               Value << ((byte)DiffVarBits[local_1c] & 0x1f) |
               ELCubes[CubeNum]->pCubeDataIn[DiffVarWords[local_1c]];
        }
        ELCubes[CubeNum]->a = (short)StartingLiterals + (short)CubeLiterals[CubeNum];
        ELCubes[CubeNum]->z = (short)NewZ;
        iVar2 = ComputeQCostBits(ELCubes[CubeNum]);
        ELCubes[CubeNum]->q = (short)iVar2;
        if (NewZ == 0xff) {
          __assert_fail("NewZ != 255",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                        ,0x295,"int ExorLinkCubeIteratorNext(Cube **)");
        }
        bVar1 = (byte)g_CoverInfo.cIDs;
        g_CoverInfo.cIDs = g_CoverInfo.cIDs + 1;
        ELCubes[CubeNum]->ID = bVar1;
        if (g_CoverInfo.cIDs == 0x100) {
          g_CoverInfo.cIDs = 1;
        }
      }
      pGroup[local_20] = ELCubes[CubeNum];
    }
    VisitedGroups = s_BitMasks[GroupCostBestNum] | VisitedGroups;
    lVar4 = (long)nVisitedGroups;
    nVisitedGroups = nVisitedGroups + 1;
    GroupOrder[lVar4] = GroupCostBestNum;
    pGroup_local._4_4_ = 1;
  }
  return pGroup_local._4_4_;
}

Assistant:

int ExorLinkCubeIteratorNext( Cube** pGroup )
// give the next group in the decreasing order of sum of literals
// returns 1 on success, returns 0 if there are no more groups
{
    int i, c;

    // check that everything is okey
    assert( fWorking );

    if ( nVisitedGroups == nGroups ) 
    // we have iterated through all groups
        return 0;

    // find the min/max cost group
    if ( fMinLitGroupsFirst[nDist] ) 
//  if ( nCubes == 4 ) 
    { // find the minimum cost
        // go through all groups
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != LARGE_NUM );
    }
    else 
    { // find the maximum cost
        // go through all groups
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != -1 );
    }

    // create the cubes needed for the group, if they are not created already
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        if ( ELCubes[CubeNum] == NULL ) // this cube does not exist
        {
            // bring a cube from the free cube list
            ELCubes[CubeNum] = GetFreeCube();

            // copy the input bit data into the cube 
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

            // copy the output bit data into the cube
            NewZ = 0;
            if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
            {
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
                NewZ = pCA->z;
            }
            else // the output is involved
            { // determine where the output information comes from
                Value = s_ELCubeRules[nDist][CubeNum][nDiffVarsIn];
                if ( Value == vs0 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vs1 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vsX )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
            }

            // set the variables that should be there
            for ( i = 0; i < nDiffVarsIn; i++ )
            {
                Value = DiffVarValues[i][ s_ELCubeRules[nDist][CubeNum][i] ];
                ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
            }

            // set the number of literals and output ones
            ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
            ELCubes[CubeNum]->z = NewZ;
            ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );
            assert( NewZ != 255 );

            // assign the ID
            ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
            // skip through zero-ID
            if ( g_CoverInfo.cIDs == 256 )
                g_CoverInfo.cIDs = 1;

        }
        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the next visited group number and
    // increment the counter of visited groups
    GroupOrder[ nVisitedGroups++ ] = GroupCostBestNum;
    return 1;
}